

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O2

Class * __thiscall
cppgenerate::Class::addSystemIncludes
          (Class *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *includeFiles)

{
  string *psVar1;
  string *psVar2;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  
  psVar1 = *(string **)(includeFiles + 8);
  for (psVar2 = *(string **)includeFiles; psVar2 != psVar1; psVar2 = psVar2 + 0x20) {
    std::__cxx11::string::string((string *)&bStack_48,psVar2);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->m_systemIncludes,&bStack_48);
    std::__cxx11::string::~string((string *)&bStack_48);
  }
  return this;
}

Assistant:

Class& Class::addSystemIncludes( std::vector<std::string> includeFiles ){
    for( std::string str : includeFiles ){
        m_systemIncludes.insert( str );
    }
        
    return *this;
}